

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_common_intrin.h
# Opt level: O2

__m128i convolve_12tap(__m128i *s,__m128i *coeffs)

{
  longlong in_RAX;
  longlong in_RDX;
  __m128i alVar1;
  
  pmaddwd((undefined1  [16])*s,(undefined1  [16])*coeffs);
  pmaddwd((undefined1  [16])s[1],(undefined1  [16])coeffs[1]);
  pmaddwd((undefined1  [16])s[2],(undefined1  [16])coeffs[2]);
  pmaddwd((undefined1  [16])s[3],(undefined1  [16])coeffs[3]);
  pmaddwd((undefined1  [16])s[4],(undefined1  [16])coeffs[4]);
  pmaddwd((undefined1  [16])s[5],(undefined1  [16])coeffs[5]);
  alVar1[1] = in_RDX;
  alVar1[0] = in_RAX;
  return alVar1;
}

Assistant:

static inline __m128i convolve_12tap(const __m128i *s, const __m128i *coeffs) {
  const __m128i d0 = _mm_madd_epi16(s[0], coeffs[0]);
  const __m128i d1 = _mm_madd_epi16(s[1], coeffs[1]);
  const __m128i d2 = _mm_madd_epi16(s[2], coeffs[2]);
  const __m128i d3 = _mm_madd_epi16(s[3], coeffs[3]);
  const __m128i d4 = _mm_madd_epi16(s[4], coeffs[4]);
  const __m128i d5 = _mm_madd_epi16(s[5], coeffs[5]);
  const __m128i d_0123 =
      _mm_add_epi32(_mm_add_epi32(d0, d1), _mm_add_epi32(d2, d3));
  const __m128i d = _mm_add_epi32(_mm_add_epi32(d4, d5), d_0123);
  return d;
}